

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O2

void __thiscall
mp::BasicSolver::UseOptionFile(BasicSolver *this,SolverOption *param_1,StringRef value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  Error *this_00;
  int *piVar3;
  uint uVar4;
  long lVar5;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __it;
  char **in_R8;
  _Alloc_hider this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  size_type sVar7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_290;
  undefined1 local_270 [8];
  function<void_(const_char_*)> local_268;
  StringRef value_local;
  ifstream ifs;
  uint auStack_218 [122];
  
  value_local.size_ = value.size_;
  value_local.data_ = value.data_;
  fmt::BasicStringRef::operator_cast_to_string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ifs,
             (BasicStringRef *)&value_local);
  std::__cxx11::string::operator=((string *)&this->option_file_save_,(string *)&ifs);
  std::__cxx11::string::~string((string *)&ifs);
  fmt::BasicStringRef::operator_cast_to_string(&local_290,(BasicStringRef *)&value_local);
  std::ifstream::ifstream(&ifs,(string *)&local_290,_S_in);
  std::__cxx11::string::~string((string *)&local_290);
  uVar4 = *(uint *)((long)auStack_218 + *(long *)(_ifs + -0x18));
  if (uVar4 == 0) {
    local_268.super__Function_base._M_functor._8_8_ = 0;
    local_268._M_invoker =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/src/solver.cc:856:32)>
         ::_M_invoke;
    local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
    local_290._M_string_length = 0;
    local_268.super__Function_base._M_manager =
         std::
         _Function_handler<void_(const_char_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ampl[P]mp/src/solver.cc:856:32)>
         ::_M_manager;
    local_290.field_2._M_local_buf[0] = '\0';
    local_268.super__Function_base._M_functor._M_unused._M_object = this;
LAB_001cd1ea:
    do {
      if (*(int *)((long)auStack_218 + *(long *)(_ifs + -0x18)) != 0) goto LAB_001cd2dc;
      __it._M_current = (char *)&local_290;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ifs,(string *)&local_290);
      if (local_290._M_string_length != 0) {
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(local_290._M_dataplus._M_p + local_290._M_string_length);
        this_01._M_p = local_290._M_dataplus._M_p;
        sVar7 = local_290._M_string_length;
        for (lVar5 = (long)local_290._M_string_length >> 2;
            paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)this_01._M_p, 0 < lVar5; lVar5 = lVar5 + -1) {
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<mp::ProcessLines_AvoidComments(std::istream&,std::function<void(char_const*)>)::$_0>
                  ::operator()((_Iter_pred<mp::ProcessLines_AvoidComments(std::istream&,std::function<void(char_const*)>)::__0>
                                *)this_01._M_p,__it);
          if (bVar2) goto LAB_001cd2b9;
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<mp::ProcessLines_AvoidComments(std::istream&,std::function<void(char_const*)>)::$_0>
                  ::operator()((_Iter_pred<mp::ProcessLines_AvoidComments(std::istream&,std::function<void(char_const*)>)::__0>
                                *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)(this_01._M_p + 1))->_M_local_buf,__it);
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(this_01._M_p + 1);
          if (bVar2) goto LAB_001cd2b9;
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<mp::ProcessLines_AvoidComments(std::istream&,std::function<void(char_const*)>)::$_0>
                  ::operator()((_Iter_pred<mp::ProcessLines_AvoidComments(std::istream&,std::function<void(char_const*)>)::__0>
                                *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)(this_01._M_p + 2))->_M_local_buf,__it);
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(this_01._M_p + 2);
          if (bVar2) goto LAB_001cd2b9;
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<mp::ProcessLines_AvoidComments(std::istream&,std::function<void(char_const*)>)::$_0>
                  ::operator()((_Iter_pred<mp::ProcessLines_AvoidComments(std::istream&,std::function<void(char_const*)>)::__0>
                                *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                    *)(this_01._M_p + 3))->_M_local_buf,__it);
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(this_01._M_p + 3);
          if (bVar2) goto LAB_001cd2b9;
          this_01._M_p = this_01._M_p + 4;
          sVar7 = sVar7 - 4;
        }
        if (sVar7 == 1) {
LAB_001cd2a8:
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<mp::ProcessLines_AvoidComments(std::istream&,std::function<void(char_const*)>)::$_0>
                  ::operator()((_Iter_pred<mp::ProcessLines_AvoidComments(std::istream&,std::function<void(char_const*)>)::__0>
                                *)this_01._M_p,__it);
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)this_01._M_p;
          if (!bVar2) {
            paVar6 = paVar1;
          }
        }
        else if (sVar7 == 2) {
LAB_001cd299:
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<mp::ProcessLines_AvoidComments(std::istream&,std::function<void(char_const*)>)::$_0>
                  ::operator()((_Iter_pred<mp::ProcessLines_AvoidComments(std::istream&,std::function<void(char_const*)>)::__0>
                                *)this_01._M_p,__it);
          paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)this_01._M_p;
          if (!bVar2) {
            this_01._M_p = this_01._M_p + 1;
            goto LAB_001cd2a8;
          }
        }
        else {
          if (sVar7 != 3) goto LAB_001cd1ea;
          bVar2 = __gnu_cxx::__ops::
                  _Iter_pred<mp::ProcessLines_AvoidComments(std::istream&,std::function<void(char_const*)>)::$_0>
                  ::operator()((_Iter_pred<mp::ProcessLines_AvoidComments(std::istream&,std::function<void(char_const*)>)::__0>
                                *)this_01._M_p,__it);
          if (!bVar2) {
            this_01._M_p = this_01._M_p + 1;
            goto LAB_001cd299;
          }
        }
LAB_001cd2b9:
        if ((paVar1 != paVar6) &&
           ((_Iter_pred<mp::ProcessLines_AvoidComments(std::istream&,std::function<void(char_const*)>)::__0>
             )paVar6->_M_local_buf[0] !=
            (_Iter_pred<mp::ProcessLines_AvoidComments(std::istream&,std::function<void(char_const*)>)::__0>
             )0x23)) {
          std::function<void_(const_char_*)>::operator()(&local_268,paVar6->_M_local_buf);
        }
      }
    } while( true );
  }
LAB_001cd300:
  if ((char)((uVar4 & 2) >> 1) == '\0' && uVar4 != 0) {
    this_00 = (Error *)__cxa_allocate_exception(0x18);
    piVar3 = __errno_location();
    local_270 = (undefined1  [8])strerror(*piVar3);
    fmt::format<fmt::BasicStringRef<char>,char*>
              (&local_290,(fmt *)"Failed to read option file \'{}\': {}",(CStringRef)&value_local,
               (BasicStringRef<char> *)local_270,in_R8);
    Error::Error(this_00,(CStringRef)local_290._M_dataplus._M_p,-1);
    __cxa_throw(this_00,&Error::typeinfo,fmt::SystemError::~SystemError);
  }
  std::ifstream::~ifstream(&ifs);
  return;
LAB_001cd2dc:
  std::__cxx11::string::~string((string *)&local_290);
  std::_Function_base::~_Function_base(&local_268.super__Function_base);
  uVar4 = *(uint *)((long)auStack_218 + *(long *)(_ifs + -0x18));
  goto LAB_001cd300;
}

Assistant:

void BasicSolver::UseOptionFile(const SolverOption &, fmt::StringRef value) {
  option_file_save_ = value;
  std::ifstream ifs(value);
  if (ifs.good())
    ProcessLines_AvoidComments(ifs,
                               [this](const char* s)
    { ParseOptionString(s, option_flag_save_); });
  if (!ifs.good() && !ifs.eof())
    MP_RAISE(fmt::format("Failed to read option file '{}': {}",
                         value, std::strerror(errno)));
}